

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

lws * lws_client_reset(lws **pwsi,int ssl,char *address,int port,char *path,char *host,char weak)

{
  lws *wsi_00;
  int iVar1;
  char *pcVar2;
  bool local_ad;
  int local_ac;
  int n;
  size_t o;
  lws *wsi;
  char *cisin [8];
  _lws_websocket_related *local_50;
  _lws_websocket_related *ws;
  lws_context_per_thread *pt;
  char *host_local;
  char *path_local;
  int port_local;
  char *address_local;
  int ssl_local;
  lws **pwsi_local;
  
  if (pwsi == (lws **)0x0) {
    pwsi_local = (lws **)0x0;
  }
  else {
    wsi_00 = *pwsi;
    pcVar2 = lws_wsi_tag(wsi_00);
    _lws_log(0x10,"%s: %s: redir %d: %s\n","lws_client_reset",pcVar2,
             (ulong)(uint)(int)wsi_00->redirects,address);
    if (wsi_00->redirects == '\x04') {
      _lws_log(1,"%s: Too many redirects\n","lws_client_reset");
      pwsi_local = (lws **)0x0;
    }
    else {
      wsi_00->redirects = wsi_00->redirects + '\x01';
      local_ad = false;
      if (*path == '/') {
        local_ad = path[1] == '/';
      }
      memset(&wsi,0,0x40);
      cisin[0] = path + (int)(uint)local_ad;
      wsi = (lws *)address;
      cisin[1] = host;
      for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
        pcVar2 = lws_hdr_simple_ptr(wsi_00,(uint)hnames2[local_ac]);
        cisin[(long)(local_ac + 3) + -1] = pcVar2;
      }
      cisin[6] = wsi_00->alpn;
      iVar1 = lws_client_stash_create(wsi_00,(char **)&wsi);
      if (iVar1 == 0) {
        path_local._4_4_ = port;
        address_local._4_4_ = ssl;
        if (port == 0) {
          _lws_log(8,"%s: forcing port 443\n","lws_client_reset");
          path_local._4_4_ = 0x1bb;
          address_local._4_4_ = 1;
        }
        wsi_00->c_port = (uint16_t)path_local._4_4_;
        wsi_00->flags = wsi_00->flags & 0xfffffffeU | (uint)(address_local._4_4_ != 0);
        _lws_log(4,"%s: REDIRECT %s:%d, path=\'%s\', ssl = %d, alpn=\'%s\'\n","lws_client_reset",
                 address,(ulong)path_local._4_4_,path,address_local._4_4_,cisin[6]);
        if (*cisin[6] == '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/client/client-http.c"
                        ,0x66d,
                        "struct lws *lws_client_reset(struct lws **, int, const char *, int, const char *, const char *, char)"
                       );
        }
        __remove_wsi_socket_from_fds(wsi_00);
        if (weak != '\0') {
          local_50 = wsi_00->ws;
          wsi_00->ws = (_lws_websocket_related *)0x0;
        }
        __lws_reset_wsi(wsi_00);
        if (weak != '\0') {
          wsi_00->ws = local_50;
        }
        *(ulong *)&wsi_00->field_0x46e =
             *(ulong *)&wsi_00->field_0x46e & 0xfdffffffffffffff | 0x200000000000000;
        wsi_00->field_0x476 = wsi_00->field_0x476 & 0xfb | 4;
        pwsi_local = (lws **)*pwsi;
      }
      else {
        pwsi_local = (lws **)0x0;
      }
    }
  }
  return (lws *)pwsi_local;
}

Assistant:

struct lws *
lws_client_reset(struct lws **pwsi, int ssl, const char *address, int port,
		 const char *path, const char *host, char weak)
{
	struct lws_context_per_thread *pt;
#if defined(LWS_ROLE_WS)
	struct _lws_websocket_related *ws;
#endif
	const char *cisin[CIS_COUNT];
	struct lws *wsi;
	size_t o;
	int n;

	if (!pwsi)
		return NULL;

	wsi = *pwsi;
	pt = &wsi->a.context->pt[(int)wsi->tsi];

	lwsl_debug("%s: %s: redir %d: %s\n", __func__, lws_wsi_tag(wsi),
			wsi->redirects, address);

	if (wsi->redirects == 4) {
		lwsl_err("%s: Too many redirects\n", __func__);
		return NULL;
	}
	wsi->redirects++;

	/*
	 * goal is to close our role part, close the sockfd, detach the ah
	 * but leave our wsi extant and still bound to whatever vhost it was
	 */

	o = path[0] == '/' && path[1] == '/';

	memset((char *)cisin, 0, sizeof(cisin));

	cisin[CIS_ADDRESS]	= address;
	cisin[CIS_PATH]		= path + o;
	cisin[CIS_HOST]		= host;

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		cisin[n + 3] = lws_hdr_simple_ptr(wsi, hnames2[n]);

#if defined(LWS_WITH_TLS)
	cisin[CIS_ALPN]		= wsi->alpn;
#endif

	if (lws_client_stash_create(wsi, cisin))
		return NULL;

	if (!port) {
		lwsl_info("%s: forcing port 443\n", __func__);

		port = 443;
		ssl = 1;
	}

	wsi->c_port = (uint16_t)port;

	wsi->flags = (wsi->flags & (~LCCSCF_USE_SSL)) |
					(ssl ? LCCSCF_USE_SSL : 0);

	lwsl_notice("%s: REDIRECT %s:%d, path='%s', ssl = %d, alpn='%s'\n",
		    __func__, address, port, path, ssl, cisin[CIS_ALPN]);

	if (!cisin[CIS_ALPN][0])
		assert(0);

	lws_pt_lock(pt, __func__);
	__remove_wsi_socket_from_fds(wsi);
	lws_pt_unlock(pt);

#if defined(LWS_ROLE_WS)
	if (weak) {
		ws = wsi->ws;
		wsi->ws = NULL;
	}
#endif

	/*
	 * After this point we can't trust the incoming strings like address,
	 * path any more, since they may have been pointing into the old ah.
	 *
	 * We must use the copies in the wsi->stash instead if we want them.
	 */

	__lws_reset_wsi(wsi); /* detaches ah here */
#if defined(LWS_ROLE_WS)
	if (weak)
		wsi->ws = ws;
#endif
	wsi->client_pipeline = 1;

	/*
	 * Will complete at close flow
	 */

	wsi->close_is_redirect = 1;

	return *pwsi;
}